

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O1

void * createcell68k(uint type)

{
  uint uVar1;
  uint uVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  LispPTR *base;
  ulong uVar5;
  DLword *pDVar6;
  uint uVar7;
  
  pDVar3 = DTDspace;
  uVar7 = type << 4;
  uVar5 = (ulong)(type * 2);
  if (DTDspace[(ulong)uVar7 + uVar5 + 2] == 0) {
    error("createcell : Attempt to create a cell not declared yet");
  }
  uVar1 = *(uint *)(pDVar3 + (ulong)uVar7 + uVar5 + 4);
  pDVar6 = Lisp_world;
  while (uVar1 = uVar1 & 0xfffffff, Lisp_world = pDVar6, uVar1 == 0) {
    base = alloc_mdspage(pDVar3[(ulong)uVar7 + uVar5 + 0x11]);
    LVar4 = initmdspage(base,pDVar3[(ulong)uVar7 + uVar5 + 2],0);
    *(LispPTR *)(pDVar3 + (ulong)uVar7 + uVar5 + 4) = LVar4;
    if ((LVar4 >> 0x1b & 1) != 0) {
      error("bad entry on free chain.");
    }
    pDVar6 = Lisp_world;
    uVar1 = *(uint *)(pDVar3 + (ulong)uVar7 + uVar5 + 4);
  }
  if (*(int *)(pDVar6 + uVar1) == 0xe0001) {
    error("N_OP_createcell E0001 error");
  }
  uVar2 = *(uint *)(pDVar6 + uVar1);
  *(uint *)(pDVar3 + (ulong)uVar7 + uVar5 + 4) = uVar2 & 0xfffffff;
  if ((uVar2 >> 0x1b & 1) != 0) {
    error("bad entry on free chain.");
  }
  *(int *)(pDVar3 + (ulong)uVar7 + uVar5 + 0xc) = *(int *)(pDVar3 + (ulong)uVar7 + uVar5 + 0xc) + 1;
  if (pDVar3[(ulong)uVar7 + uVar5 + 2] != 0) {
    pDVar6 = pDVar6 + uVar1;
    uVar5 = (ulong)((uint)pDVar3[(ulong)uVar7 + uVar5 + 2] * 2);
    do {
      *(undefined2 *)((ulong)pDVar6 ^ 2) = 0;
      pDVar6 = pDVar6 + 1;
      uVar5 = uVar5 - 2;
    } while (uVar5 != 0);
  }
  if ((-1 < *(short *)((ulong)(uVar1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(uVar1,1);
    }
    else {
      htfind(uVar1,1);
    }
  }
  return (void *)((ulong)(uVar1 * 2) + (long)Lisp_world);
}

Assistant:

void *createcell68k(unsigned int type) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("createcell : Can't create Listp cell with CREATECELL");
  if (type == TYPE_STREAM) stab();

  check_dtd_chain(type);

#endif

  dtd68k = (struct dtd *)GetDTD(type);

  if (dtd68k->dtd_size == 0) error("createcell : Attempt to create a cell not declared yet");

retry:
  if ((newcell = (dtd68k->dtd_free & POINTERMASK)) != NIL) {
#ifdef DTDDEBUG
    if (type != GetTypeNumber(newcell)) error("createcell : BAD cell in dtdfree");
    if (newcell > POINTERMASK) error("createcell : BAD Lisp address");
#endif

    ptr = NativeAligned2FromLAddr(newcell);

    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");

    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    if ((dtd68k->dtd_free != 0) && (type != GetTypeNumber(dtd68k->dtd_free)))
      error("createcell : BAD cell in next dtdfree");
    check_dtd_chain(type);

#endif

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	IncAllocCnt(1); */
    GCLOOKUP(newcell, DELREF);

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    return (NativeAligned2FromLAddr(newcell)); /* XXX: is it really only aligned(2)? */

  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    goto retry;
  }

}